

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String * __thiscall Bstrlib::String::operator+=(String *this,uint64 c)

{
  String *pSVar1;
  String local_28;
  uint64 local_18;
  uint64 c_local;
  String *this_local;
  
  local_18 = c;
  c_local = (uint64)this;
  Print((char *)&local_28,"%llu",c);
  pSVar1 = operator+=(this,&local_28);
  ~String(&local_28);
  return pSVar1;
}

Assistant:

const String& String::operator +=(const uint64 c)
    {
#ifndef HasFloatParsing
        char buffer[21] = { 0 };
        Strings::ulltoa(c, buffer, 10);
        return *this += buffer;
#else
        return *this += String::Print(PF_LLU, c);
#endif
    }